

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

bool SetGenericProperty<int>
               (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *list,char *szName,int *value)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  uint32_t hash;
  pair<unsigned_int,_int> local_28;
  
  if (szName != (char *)0x0) {
    hash = SuperFastHash(szName,0,0);
    iVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
            ::find(&list->_M_t,&hash);
    p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
      local_28.first = hash;
      local_28.second = *value;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
      ::_M_emplace_unique<std::pair<unsigned_int,int>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                  *)list,&local_28);
    }
    else {
      *(int *)&iVar2._M_node[1].field_0x4 = *value;
    }
    return (_Rb_tree_header *)iVar2._M_node != p_Var1;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/GenericProperty.h"
                ,0x3e,
                "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = int]"
               );
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}